

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * sx_strchar(char *str,char ch)

{
  ulong uVar1;
  char *pcVar2;
  uint8_t *char_ptr;
  ulong *puVar3;
  char cVar4;
  ulong uVar5;
  
  if (((ulong)str & 7) != 0) {
    pcVar2 = str + 1;
    do {
      if ((char)*(ulong *)str == ch) {
        return (char *)(ulong *)str;
      }
      if ((char)*(ulong *)str == '\0') {
        return (char *)0x0;
      }
      str = (char *)((long)str + 1);
      uVar1 = (ulong)pcVar2 & 7;
      pcVar2 = pcVar2 + 1;
    } while (uVar1 != 0);
  }
LAB_0010988a:
  do {
    puVar3 = (ulong *)str;
    uVar1 = *puVar3;
    str = (char *)(puVar3 + 1);
    if (((0x8101010101010100 - uVar1 ^ uVar1) & 0x8101010101010100) == 0) {
      uVar5 = uVar1 ^ (ulong)(byte)ch * 0x101010101010101;
      if (((0x8101010101010100 - uVar5 ^ uVar5) & 0x8101010101010100) == 0) goto LAB_0010988a;
    }
    if ((char)uVar1 == ch) {
      return (char *)puVar3;
    }
    if ((char)uVar1 == '\0') {
      return (char *)0x0;
    }
    cVar4 = (char)(uVar1 >> 8);
    if (cVar4 == ch) {
      return (char *)((long)puVar3 + 1);
    }
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    cVar4 = (char)(uVar1 >> 0x10);
    if (cVar4 == ch) {
      return (char *)((long)puVar3 + 2);
    }
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    cVar4 = (char)(uVar1 >> 0x18);
    if (cVar4 == ch) {
      return (char *)((long)puVar3 + 3);
    }
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    cVar4 = (char)(uVar1 >> 0x20);
    if (cVar4 == ch) {
      return (char *)((long)puVar3 + 4);
    }
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    cVar4 = (char)(uVar1 >> 0x28);
    if (cVar4 == ch) {
      return (char *)((long)puVar3 + 5);
    }
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    cVar4 = (char)(uVar1 >> 0x30);
    if (cVar4 == ch) {
      return (char *)((long)puVar3 + 6);
    }
    if (cVar4 == '\0') {
      return (char *)0x0;
    }
    if ((char)(uVar1 >> 0x38) == ch) {
      return (char *)((long)puVar3 + 7);
    }
    if (uVar1 >> 0x38 == 0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* sx_strchar(const char* str, char ch)
{
    const uint8_t* char_ptr;
    uintptr_t* longword_ptr;
    uintptr_t longword, magic_bits, charmask;
    uint8_t c = (uint8_t)ch;

    // Handle the first few characters by reading one character at a time.
    // Do this until CHAR_PTR is aligned on a longword boundary.
    for (char_ptr = (const uint8_t*)str; ((uintptr_t)char_ptr & (sizeof(longword) - 1)) != 0;
         ++char_ptr) {
        if (*char_ptr == c)
            return (const char*)char_ptr;
        else if (*char_ptr == '\0')
            return NULL;
    }

    longword_ptr = (uintptr_t*)char_ptr;
    magic_bits = (uintptr_t)-1;
    magic_bits = magic_bits / 0xff * 0xfe << 1 >> 1 | 1;
    charmask = c | (c << 8);
    charmask |= charmask << 16;
#if SX_ARCH_64BIT
    charmask |= (charmask << 16) << 16;
#endif

    for (;;) {
        longword = *longword_ptr++;

        if ((((longword + magic_bits) ^ ~longword) & ~magic_bits) != 0 ||
            ((((longword ^ charmask) + magic_bits) ^ ~(longword ^ charmask)) & ~magic_bits) != 0) {
            const uint8_t* cp = (const uint8_t*)(longword_ptr - 1);

            if (*cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
#if SX_ARCH_64BIT
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
            if (*++cp == c)
                return (const char*)cp;
            else if (*cp == '\0')
                break;
#endif
        }
    }

    return NULL;
}